

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerator.cxx
# Opt level: O3

bool __thiscall cmQtAutoGenerator::Run(cmQtAutoGenerator *this,string *infoFile,string *config)

{
  string *psVar1;
  bool bVar2;
  int iVar3;
  cmMakefile *this_00;
  __single_object makefile;
  cmStateSnapshot snapshot;
  cmake cm;
  string msg;
  _Head_base<0UL,_cmMakefile_*,_false> local_a28;
  undefined1 local_a20 [16];
  undefined1 local_a10 [32];
  pointer local_9f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_9e8;
  cmStateSnapshot local_9d8;
  undefined1 local_9c0 [840];
  cmState *local_678;
  cmLinkedTree<cmStateDetail::SnapshotDataType> *pcStack_670;
  size_type local_668;
  undefined1 local_638 [176];
  cmMakefile *local_588;
  
  psVar1 = &this->InfoFile_;
  std::__cxx11::string::_M_assign((string *)psVar1);
  cmsys::SystemTools::ConvertToUnixSlashes(psVar1);
  bVar2 = cmFileTime::Load(&this->InfoFileTime_,psVar1);
  if (bVar2) {
    cmsys::SystemTools::GetFilenamePath((string *)local_638,infoFile);
    psVar1 = &this->InfoDir_;
    std::__cxx11::string::operator=((string *)psVar1,(string *)local_638);
    if ((undefined1 *)local_638._0_8_ != local_638 + 0x10) {
      operator_delete((void *)local_638._0_8_,local_638._16_8_ + 1);
    }
    std::__cxx11::string::_M_assign((string *)&this->InfoConfig_);
    cmake::cmake((cmake *)local_9c0,RoleScript,Unknown);
    cmake::SetHomeOutputDirectory((cmake *)local_9c0,psVar1);
    cmake::SetHomeDirectory((cmake *)local_9c0,psVar1);
    local_638._16_8_ = local_668;
    local_638._0_8_ = local_678;
    local_638._8_8_ = pcStack_670;
    cmStateSnapshot::SetDefaultDefinitions((cmStateSnapshot *)local_638);
    cmGlobalGenerator::cmGlobalGenerator((cmGlobalGenerator *)local_638,(cmake *)local_9c0);
    local_9d8.Position.Position = local_668;
    local_9d8.State = local_678;
    local_9d8.Position.Tree = pcStack_670;
    cmStateSnapshot::GetDirectory((cmStateDirectory *)local_a20,&local_9d8);
    cmStateDirectory::SetCurrentBinary((cmStateDirectory *)local_a20,psVar1);
    cmStateSnapshot::GetDirectory((cmStateDirectory *)local_a20,&local_9d8);
    cmStateDirectory::SetCurrentSource((cmStateDirectory *)local_a20,psVar1);
    this_00 = (cmMakefile *)operator_new(0x7e8);
    cmMakefile::cmMakefile(this_00,(cmGlobalGenerator *)local_638,&local_9d8);
    local_a28._M_head_impl = this_00;
    local_a20._0_8_ = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_a10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a20,"3.9","");
    local_9f0 = (pointer)0x0;
    local_9e8._M_local_buf[0] = '\0';
    local_a10._24_8_ = &local_9e8;
    cmMakefile::SetPolicyVersion(this_00,(string *)local_a20,(string *)(local_a10 + 0x18));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a10._24_8_ != &local_9e8) {
      operator_delete((void *)local_a10._24_8_,
                      CONCAT71(local_9e8._M_allocated_capacity._1_7_,local_9e8._M_local_buf[0]) + 1)
      ;
    }
    if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_a20._0_8_ !=
        (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_a10) {
      operator_delete((void *)local_a20._0_8_,(ulong)(local_a10._0_8_ + 1));
    }
    local_588 = local_a28._M_head_impl;
    iVar3 = (*this->_vptr_cmQtAutoGenerator[2])(this);
    std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::~unique_ptr
              ((unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_> *)&local_a28);
    cmGlobalGenerator::~cmGlobalGenerator((cmGlobalGenerator *)local_638);
    cmake::~cmake((cmake *)local_9c0);
    if ((char)iVar3 != '\0') {
      iVar3 = (*this->_vptr_cmQtAutoGenerator[3])(this);
      return (bool)(char)iVar3;
    }
  }
  else {
    local_638._0_8_ = local_638 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_638,"AutoGen: The info file ","");
    cmQtAutoGen::Quoted((string *)local_9c0,psVar1);
    std::__cxx11::string::_M_append(local_638,local_9c0._0_8_);
    if ((undefined1 *)local_9c0._0_8_ != local_9c0 + 0x10) {
      operator_delete((void *)local_9c0._0_8_,local_9c0._16_8_ + 1);
    }
    std::__cxx11::string::append(local_638);
    cmSystemTools::Stderr((string *)local_638);
    if ((undefined1 *)local_638._0_8_ != local_638 + 0x10) {
      operator_delete((void *)local_638._0_8_,local_638._16_8_ + 1);
    }
  }
  return false;
}

Assistant:

bool cmQtAutoGenerator::Run(std::string const& infoFile,
                            std::string const& config)
{
  // Info settings
  InfoFile_ = infoFile;
  cmSystemTools::ConvertToUnixSlashes(InfoFile_);
  if (!InfoFileTime_.Load(InfoFile_)) {
    std::string msg = "AutoGen: The info file ";
    msg += Quoted(InfoFile_);
    msg += " is not readable\n";
    cmSystemTools::Stderr(msg);
    return false;
  }
  InfoDir_ = cmSystemTools::GetFilenamePath(infoFile);
  InfoConfig_ = config;

  bool success = false;
  {
    cmake cm(cmake::RoleScript, cmState::Unknown);
    cm.SetHomeOutputDirectory(InfoDir());
    cm.SetHomeDirectory(InfoDir());
    cm.GetCurrentSnapshot().SetDefaultDefinitions();
    cmGlobalGenerator gg(&cm);

    cmStateSnapshot snapshot = cm.GetCurrentSnapshot();
    snapshot.GetDirectory().SetCurrentBinary(InfoDir());
    snapshot.GetDirectory().SetCurrentSource(InfoDir());

    auto makefile = cm::make_unique<cmMakefile>(&gg, snapshot);
    // The OLD/WARN behavior for policy CMP0053 caused a speed regression.
    // https://gitlab.kitware.com/cmake/cmake/issues/17570
    makefile->SetPolicyVersion("3.9", std::string());
    gg.SetCurrentMakefile(makefile.get());
    success = this->Init(makefile.get());
  }
  if (success) {
    success = this->Process();
  }
  return success;
}